

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  undefined8 uVar4;
  int iVar5;
  XML_Convert_Result XVar6;
  undefined8 in_RAX;
  char **ppcVar7;
  char **ppcVar8;
  uint uVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  unsigned_short *in_R8;
  long lVar11;
  int tok;
  undefined8 uStack_38;
  uint uVar10;
  
  ppcVar7 = (char **)(end + -(long)ptr);
  if ((long)ppcVar7 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  uStack_38 = in_RAX;
  if (bVar1 < 0x16) {
    if (bVar1 == 5) {
      if (ppcVar7 == (char **)0x1) {
        return -2;
      }
      iVar5 = (*enc[3].scanners[1])(enc,ptr,end,ppcVar7);
      lVar11 = 2;
    }
    else if (bVar1 == 6) {
      if (ppcVar7 < (char **)0x3) {
        return -2;
      }
      iVar5 = (*enc[3].scanners[2])(enc,ptr,end,ppcVar7);
      lVar11 = 3;
    }
    else {
      if (bVar1 != 7) goto LAB_00555977;
      if (ppcVar7 < (char **)0x4) {
        return -2;
      }
      iVar5 = (*enc[3].literalScanners[0])(enc,ptr,end,ppcVar7);
      lVar11 = 4;
    }
    if (iVar5 == 0) {
LAB_00555977:
      *nextTokPtr = ptr;
      return 0;
    }
  }
  else {
    lVar11 = 1;
    if ((bVar1 != 0x16) && (bVar1 != 0x18)) goto LAB_00555977;
  }
  ppcVar7 = (char **)(ptr + lVar11);
  uVar4 = uStack_38;
  do {
    uVar2 = (long)end - (long)ppcVar7;
    if ((long)uVar2 < 1) {
      return -1;
    }
    uStack_38._4_4_ = (int)((ulong)uVar4 >> 0x20);
    uVar10 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar7);
    uVar9 = uVar10 - 5;
    if (0x18 < uVar9) {
switchD_005558fc_caseD_8:
      ppcVar8 = ppcVar7;
LAB_00555ac5:
      *nextTokPtr = (char *)ppcVar8;
      return 0;
    }
    lVar11 = 1;
    uStack_38 = uVar4;
    switch(uVar10) {
    case 5:
      if (uVar2 == 1) {
        return -2;
      }
      XVar6 = (*enc[2].utf16Convert)
                        (enc,ppcVar7,
                         (char *)((long)&switchD_005558fc::switchdataD_0066823c +
                                 (long)(int)(&switchD_005558fc::switchdataD_0066823c)[uVar9]),
                         (unsigned_short **)0x1,in_R8);
      lVar11 = 2;
      break;
    case 6:
      if (uVar2 < 3) {
        return -2;
      }
      XVar6 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar7);
      lVar11 = 3;
      break;
    case 7:
      if (uVar2 < 4) {
        return -2;
      }
      XVar6 = (*enc[3].scanners[0])
                        (enc,(char *)ppcVar7,
                         (char *)((long)&switchD_005558fc::switchdataD_0066823c +
                                 (long)(int)(&switchD_005558fc::switchdataD_0066823c)[uVar9]),
                         (char **)0x1);
      lVar11 = 4;
      break;
    default:
      goto switchD_005558fc_caseD_8;
    case 9:
    case 10:
    case 0x15:
      iVar5 = normal_checkPiTarget
                        ((ENCODING *)ptr,(char *)ppcVar7,(char *)((long)&uStack_38 + 4),(int *)0x1);
      if (iVar5 == 0) goto switchD_005558fc_caseD_1d;
      ppcVar8 = (char **)((long)ppcVar7 + 1);
      pcVar3 = extraout_RDX;
      uVar4 = uStack_38;
      goto joined_r0x005559af;
    case 0xf:
      iVar5 = normal_checkPiTarget
                        ((ENCODING *)ptr,(char *)ppcVar7,(char *)((long)&uStack_38 + 4),(int *)0x1);
      if (iVar5 == 0) goto switchD_005558fc_caseD_1d;
      ppcVar8 = (char **)((long)ppcVar7 + 1);
      if ((char **)end == ppcVar8 || (long)end - (long)ppcVar8 < 0) {
        return -1;
      }
      if (*(char *)ppcVar8 != '>') goto LAB_00555ac5;
      goto LAB_00555aaa;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_005558fc_caseD_16;
    case 0x1d:
      goto switchD_005558fc_caseD_1d;
    }
    uVar4 = uStack_38;
    if (XVar6 == XML_CONVERT_COMPLETED) goto switchD_005558fc_caseD_1d;
switchD_005558fc_caseD_16:
    uStack_38 = uVar4;
    ppcVar7 = (char **)((long)ppcVar7 + lVar11);
    uVar4 = uStack_38;
  } while( true );
joined_r0x005559af:
  ppcVar7 = ppcVar8;
  uVar2 = (long)end - (long)ppcVar7;
  if ((long)uVar2 < 1) {
    return -1;
  }
  uStack_38._4_4_ = (int)((ulong)uVar4 >> 0x20);
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar7);
  if (0xf < (ulong)bVar1) {
switchD_005559d4_caseD_2:
    ppcVar8 = (char **)((long)ppcVar7 + 1);
    goto joined_r0x005559af;
  }
  uStack_38 = uVar4;
  switch(bVar1) {
  case 0:
  case 1:
  case 8:
switchD_005558fc_caseD_1d:
    *nextTokPtr = (char *)ppcVar7;
    return 0;
  default:
    goto switchD_005559d4_caseD_2;
  case 5:
    if (uVar2 == 1) {
      return -2;
    }
    iVar5 = (*enc[3].literalScanners[1])
                      (enc,(char *)ppcVar7,pcVar3,
                       (char **)((long)&switchD_005559d4::switchdataD_006682a0 +
                                (long)(int)(&switchD_005559d4::switchdataD_006682a0)[bVar1]));
    if (iVar5 != 0) goto switchD_005558fc_caseD_1d;
    ppcVar8 = (char **)((long)ppcVar7 + 2);
    pcVar3 = extraout_RDX_00;
    uVar4 = uStack_38;
    break;
  case 6:
    if (uVar2 < 3) {
      return -2;
    }
    iVar5 = (*enc[3].sameName)(enc,(char *)ppcVar7,pcVar3);
    if (iVar5 != 0) goto switchD_005558fc_caseD_1d;
    ppcVar8 = (char **)((long)ppcVar7 + 3);
    pcVar3 = extraout_RDX_01;
    uVar4 = uStack_38;
    break;
  case 7:
    if (uVar2 < 4) {
      return -2;
    }
    iVar5 = (*enc[3].nameMatchesAscii)
                      (enc,(char *)ppcVar7,pcVar3,
                       (char *)((long)&switchD_005559d4::switchdataD_006682a0 +
                               (long)(int)(&switchD_005559d4::switchdataD_006682a0)[bVar1]));
    if (iVar5 != 0) goto switchD_005558fc_caseD_1d;
    ppcVar8 = (char **)((long)ppcVar7 + 4);
    pcVar3 = extraout_RDX_02;
    uVar4 = uStack_38;
    break;
  case 0xf:
    ppcVar8 = (char **)((long)ppcVar7 + 1);
    if ((char **)end == ppcVar8 || (long)end - (long)ppcVar8 < 0) {
      return -1;
    }
    if (*(byte *)ppcVar8 == 0x3e) {
LAB_00555aaa:
      *nextTokPtr = (char *)((long)ppcVar7 + 2);
      return uStack_38._4_4_;
    }
  }
  goto joined_r0x005559af;
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr,
               const char *end, const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}